

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-entry.c
# Opt level: O2

void get_ui_entry_label(ui_entry *entry,wchar_t length,_Bool pad_left,wchar_t *label)

{
  wchar_t wVar1;
  wchar_t wVar2;
  wchar_t *__src;
  size_t sVar3;
  wchar_t **ppwVar4;
  ulong uVar5;
  ulong uVar6;
  wchar_t *pwVar7;
  ulong uVar8;
  ulong uVar9;
  
  if (get_ui_entry_label_first_call == '\0') {
    sVar3 = text_mbstowcs(get_ui_entry_label::spc," ",L'\x02');
    if (sVar3 == 0xffffffffffffffff) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/ui-entry.c"
                    ,0x132,"void get_ui_entry_label(const struct ui_entry *, int, _Bool, wchar_t *)"
                   );
    }
    get_ui_entry_label_first_call = '\x01';
  }
  if (length < L'\x01') {
    return;
  }
  if (length == L'\x01') {
    *label = get_ui_entry_label::spc[1];
    return;
  }
  pwVar7 = entry->nshortened + (uint)(length + L'\xfffffffe');
  if (0xb < (uint)length) {
    pwVar7 = &entry->nlabel;
  }
  ppwVar4 = entry->shortened_labels + (uint)(length + L'\xfffffffe');
  if (0xb < (uint)length) {
    ppwVar4 = &entry->label;
  }
  __src = *ppwVar4;
  wVar2 = *pwVar7;
  uVar9 = (ulong)wVar2;
  wVar1 = length + L'\xffffffff';
  uVar8 = (ulong)(uint)wVar1;
  pwVar7 = label;
  uVar5 = uVar8;
  if (wVar2 < wVar1) {
    if (!pad_left) {
      memcpy(label,__src,uVar9 << 2);
      for (; (long)uVar9 < (long)uVar8; uVar9 = uVar9 + 1) {
        label[uVar9] = get_ui_entry_label::spc[0];
      }
      goto LAB_001d2f23;
    }
    uVar6 = 0;
    uVar5 = (ulong)(uint)(wVar1 - wVar2);
    if (wVar1 - wVar2 < 1) {
      uVar5 = uVar6;
    }
    for (; uVar5 != uVar6; uVar6 = uVar6 + 1) {
      label[uVar6] = get_ui_entry_label::spc[0];
    }
    pwVar7 = label + (ulong)(uint)length + (-1 - uVar9);
    uVar5 = uVar9;
  }
  memcpy(pwVar7,__src,uVar5 * 4);
LAB_001d2f23:
  label[uVar8] = get_ui_entry_label::spc[1];
  return;
}

Assistant:

void get_ui_entry_label(const struct ui_entry *entry, int length,
	bool pad_left, wchar_t *label)
{
	static bool first_call = true;
	static wchar_t spc[2];
	const wchar_t *src;
	int n;

	if (first_call) {
		size_t nw = text_mbstowcs(spc, " ", 2);

		if (nw == (size_t)-1) assert(0);
		first_call = false;
	}

	if (length <= 0) {
		return;
	}
	if (length == 1) {
		label[0] = spc[1];
		return;
	}
	if (length <= MAX_SHORTENED + 1) {
		src = entry->shortened_labels[length - 2];
		n = entry->nshortened[length - 2];
	} else {
		src = entry->label;
		n = entry->nlabel;
	}
	if (n < length - 1) {
		int i;

		if (pad_left) {
			for (i = 0; i < length - 1 - n; ++i) {
				label[i] = spc[0];
			}
			(void) memcpy(label + length - 1 - n, src,
				n * sizeof(*label));
		} else {
			(void) memcpy(label, src, n * sizeof(*label));
			for (i = n; i < length - 1; ++i) {
				label[i] = spc[0];
			}
		}
	} else {
		(void) memcpy(label, src, (length - 1) * sizeof(*label));
	}
	label[length - 1] = spc[1];
}